

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_hadamard_32x32_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *in_RDX;
  tran_low_t *in_RSI;
  ptrdiff_t in_RDI;
  tran_low_t b3;
  tran_low_t b2;
  tran_low_t b1;
  tran_low_t b0;
  tran_low_t a3;
  tran_low_t a2;
  tran_low_t a1;
  tran_low_t a0;
  int16_t *src_ptr;
  int idx;
  int local_1c;
  int *local_18;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    aom_hadamard_16x16_c(_b3,in_RDI,in_RSI);
  }
  local_18 = in_RDX;
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    iVar1 = *local_18 + local_18[0x100] >> 2;
    iVar2 = *local_18 - local_18[0x100] >> 2;
    iVar3 = local_18[0x200] + local_18[0x300] >> 2;
    iVar4 = local_18[0x200] - local_18[0x300] >> 2;
    *local_18 = iVar1 + iVar3;
    local_18[0x100] = iVar2 + iVar4;
    local_18[0x200] = iVar1 - iVar3;
    local_18[0x300] = iVar2 - iVar4;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void aom_hadamard_32x32_c(const int16_t *src_diff, ptrdiff_t src_stride,
                          tran_low_t *coeff) {
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 9 bit, dynamic range [-255, 255]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 16 * src_stride + (idx & 0x01) * 16;
    aom_hadamard_16x16_c(src_ptr, src_stride, coeff + idx * 256);
  }

  // coeff: 16 bit, dynamic range [-32768, 32767]
  for (idx = 0; idx < 256; ++idx) {
    tran_low_t a0 = coeff[0];
    tran_low_t a1 = coeff[256];
    tran_low_t a2 = coeff[512];
    tran_low_t a3 = coeff[768];

    tran_low_t b0 = (a0 + a1) >> 2;  // (a0 + a1): 17 bit, [-65536, 65535]
    tran_low_t b1 = (a0 - a1) >> 2;  // b0-b3: 15 bit, dynamic range
    tran_low_t b2 = (a2 + a3) >> 2;  // [-16384, 16383]
    tran_low_t b3 = (a2 - a3) >> 2;

    coeff[0] = b0 + b2;  // 16 bit, [-32768, 32767]
    coeff[256] = b1 + b3;
    coeff[512] = b0 - b2;
    coeff[768] = b1 - b3;

    ++coeff;
  }
}